

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CLabelStatement *statement)

{
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_20;
  CLabelStatement *local_18;
  CLabelStatement *statement_local;
  CCallSimplifierVisitor *this_local;
  
  local_18 = statement;
  statement_local = (CLabelStatement *)this;
  (*(statement->super_CStatement).super_IStatement.super_INode._vptr_INode[3])(&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::operator=
            (&this->childStatement,&local_20);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CLabelStatement &statement) {
    childStatement = std::move(statement.Copy());
}